

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::unit_to_the_power_of(string *unit_string,int power,uint64_t match_flags)

{
  unit_data *this;
  pointer pcVar1;
  size_type sVar2;
  precise_unit pVar3;
  _Alloc_hider _Var4;
  uint uVar5;
  unit_data uVar6;
  undefined4 extraout_EAX;
  unit_data extraout_EAX_00;
  long lVar7;
  void *pvVar8;
  size_t sVar9;
  undefined8 extraout_RAX;
  size_type sVar10;
  uint uVar11;
  undefined8 uVar12;
  bool bVar13;
  double dVar14;
  double in_XMM1_Qa;
  precise_unit pVar15;
  int index;
  string ustring;
  precise_unit a_unit;
  double local_120;
  precise_unit local_118;
  double local_100;
  double local_f8;
  uint local_ec;
  uint64_t local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  precise_unit local_c0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_100 = (double)CONCAT44(local_100._4_4_,power);
  uVar11 = ~(uint)match_flags >> 2 & 0x8000;
  local_118.base_units_ = (unit_data)0xfa94a488;
  local_118.commodity_ = 0;
  local_118.multiplier_ = NAN;
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  sVar2 = unit_string->_M_string_length;
  local_ec = (int)sVar2 - 2;
  if (pcVar1[sVar2 - 1] != ')') {
LAB_003e8ea3:
    if (((uint)match_flags >> 9 & 1) != 0) {
      cleanUnitString(unit_string,match_flags);
    }
    local_118 = get_unit(unit_string,match_flags);
    dVar14 = local_118.multiplier_;
    if (local_118.base_units_ == (unit_data)0xfa94a488 && NAN(dVar14)) {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"per","");
      sVar9 = findWordOperatorSep(unit_string,(string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (sVar9 == 0xffffffffffffffff) {
        pcVar1 = (unit_string->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,pcVar1 + unit_string->_M_string_length);
        local_118 = unit_from_string_internal(&local_70,match_flags - uVar11);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        dVar14 = local_118.multiplier_;
        if ((NAN(dVar14)) && (local_118.base_units_ == -0x56b5b78)) {
          local_118.base_units_ = (unit_data)0xfa94a488;
          local_118.commodity_ = 0;
          local_118.multiplier_ = NAN;
        }
        else if (local_100._0_4_ == -1) {
          local_118 = precise_unit::inv(&local_118);
        }
        else if (local_100._0_4_ == 1) {
          local_118.multiplier_ = dVar14;
        }
        else {
          dVar14 = precise_unit::pow(&local_118,dVar14,dVar14);
          local_118.base_units_ = (unit_data)(int)extraout_RAX;
          local_118.commodity_ = (int)((ulong)extraout_RAX >> 0x20);
          local_118.multiplier_ = dVar14;
        }
      }
      else {
        local_118.base_units_ = (unit_data)0x30000000;
        local_118.commodity_ = 0;
        local_118.multiplier_ = 1.0;
      }
    }
    else if (local_100._0_4_ != 1) {
      if (local_100._0_4_ == -1) {
        uVar6 = detail::unit_data::inv(&local_118.base_units_);
        uVar11 = ~local_118.commodity_;
        if (local_118.commodity_ == 0) {
          uVar11 = 0;
        }
        local_118.commodity_ = uVar11;
        local_118.base_units_ = uVar6;
        local_118.multiplier_ = 1.0 / dVar14;
      }
      else {
        dVar14 = detail::power_const<double>(dVar14,local_100._0_4_);
        detail::unit_data::pow(&local_118.base_units_,dVar14,in_XMM1_Qa);
        local_118.base_units_ = (unit_data)extraout_EAX;
        local_118.multiplier_ = dVar14;
      }
    }
    return local_118;
  }
  segmentcheckReverse(unit_string,'(',(int *)&local_ec);
  uVar5 = local_ec;
  lVar7 = (long)(int)local_ec;
  if ((0 < lVar7) && (pcVar1[lVar7] == '^')) goto LAB_003e8ea3;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
             lVar7 + 2,(sVar2 - lVar7) - 3);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_e0._M_dataplus._M_p,
             local_e0._M_dataplus._M_p + local_e0._M_string_length);
  local_e8 = match_flags - uVar11;
  local_118 = unit_from_string_internal(&local_90,local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  _Var4._M_p = local_e0._M_dataplus._M_p;
  local_f8 = local_118.multiplier_;
  if ((NAN(local_f8)) && (local_118.base_units_ == -0x56b5b78)) {
    uVar12._0_4_ = (unit_data)0xfa94a488;
    uVar12._4_4_ = 0;
    local_120 = NAN;
    if ((int)uVar5 < 0) goto LAB_003e935d;
    if (local_e0._M_string_length != 0) {
      sVar10 = 0;
      do {
        pvVar8 = memchr("(*/^{[",(int)_Var4._M_p[sVar10],6);
        if (pvVar8 != (void *)0x0) goto LAB_003e935d;
        sVar10 = sVar10 + 1;
      } while (local_e0._M_string_length != sVar10);
    }
    pcVar1 = (unit_string->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + unit_string->_M_string_length);
    local_118 = unit_from_string_internal(&local_b0,local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_f8 = local_118.multiplier_;
    uVar11 = 0xffffffff;
    uVar5 = 0xffffffff;
    if (!NAN(local_f8)) goto LAB_003e9128;
    if (local_118.base_units_ == -0x56b5b78) goto LAB_003e935d;
  }
  else {
LAB_003e9128:
    uVar11 = uVar5;
  }
  this = &local_118.base_units_;
  if (local_100._0_4_ == 1) {
    local_120 = local_f8;
  }
  else {
    if (local_100._0_4_ == -1) {
      uVar6 = detail::unit_data::inv(this);
      bVar13 = local_118.commodity_ == 0;
      local_118.commodity_ = ~local_118.commodity_;
      if (bVar13) {
        local_118.commodity_ = 0;
      }
      local_120 = 1.0 / local_f8;
    }
    else {
      local_120 = detail::power_const<double>(local_f8,local_100._0_4_);
      detail::unit_data::pow(this,local_120,in_XMM1_Qa);
      uVar6 = extraout_EAX_00;
    }
    local_118.base_units_ = uVar6;
    local_118.multiplier_ = local_120;
  }
  if ((int)uVar11 < 0) {
    uVar12 = local_118._8_8_;
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
               (ulong)uVar11);
    pVar15 = unit_from_string_internal((string *)&local_50,local_e8);
    local_c0 = pVar15;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (pVar15.base_units_ == (unit_data)0xfa94a488 || NAN(pVar15.multiplier_)) {
      uVar12._0_4_ = (unit_data)0x30000000;
      uVar12._4_4_ = 0;
      local_120 = 1.0;
    }
    else {
      local_100 = local_118.multiplier_;
      uVar6 = detail::unit_data::operator*(&local_c0.base_units_,this);
      local_120 = pVar15.multiplier_ * local_100;
      uVar12._4_4_ = local_118.commodity_ | local_c0.commodity_;
      uVar12._0_4_ = uVar6;
    }
  }
LAB_003e935d:
  pVar3.base_units_ = SUB84(uVar12,0);
  pVar3.commodity_ = SUB84(uVar12,4);
  pVar3.multiplier_ = local_120;
  pVar15.base_units_ = SUB84(uVar12,0);
  pVar15.commodity_ = SUB84(uVar12,4);
  pVar15.multiplier_ = local_120;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
    return pVar15;
  }
  operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  return pVar3;
}

Assistant:

static precise_unit unit_to_the_power_of(
    std::string unit_string,
    int power,
    std::uint64_t match_flags)
{
    std::uint32_t recursion_modifier = recursion_depth1;
    if ((match_flags & no_recursion) != 0) {
        recursion_modifier = 0;
    }

    precise_unit retunit = precise::invalid;
    bool partialPowerSegment = (unit_string.back() == ')');
    int index = static_cast<int>(unit_string.size() - 2);
    if (partialPowerSegment) {
        segmentcheckReverse(unit_string, '(', index);
        if (index > 0 && unit_string[index] == '^') {
            partialPowerSegment = false;
        }
    }
    if (partialPowerSegment) {
        std::string ustring = unit_string.substr(
            static_cast<size_t>(index) + 2,
            unit_string.size() - static_cast<size_t>(index) - 3);
        retunit = unit_from_string_internal(
            ustring, match_flags - recursion_modifier);
        if (!is_valid(retunit)) {
            if (index >= 0) {
                if (ustring.find_first_of("(*/^{[") == std::string::npos) {
                    retunit = unit_from_string_internal(
                        unit_string, match_flags - recursion_modifier);
                    if (!is_valid(retunit)) {
                        return precise::invalid;
                    }
                    index = -1;
                } else {
                    return precise::invalid;
                }
            } else {
                return precise::invalid;
            }
        }

        if (power == -1) {
            retunit = retunit.inv();
        } else if (power != 1) {
            retunit = retunit.pow(power);
        }

        if (index < 0) {
            return retunit;
        }
        auto a_unit = unit_from_string_internal(
            unit_string.substr(0, index), match_flags - recursion_modifier);
        if (!is_error(a_unit)) {
            return a_unit * retunit;
        }
        return precise::defunit;
    }
    // auto ustring = unit_string.substr(0, pchar + 1);

    if ((match_flags & case_insensitive) != 0) {
        cleanUnitString(unit_string, match_flags);
    }

    retunit = get_unit(unit_string, match_flags);
    if (is_valid(retunit)) {
        if (power == 1) {
            return retunit;
        }
        if (power == -1) {
            return retunit.inv();
        }
        return retunit.pow(power);
    }
    auto fnd = findWordOperatorSep(unit_string, "per");
    if (fnd == std::string::npos) {
        retunit = unit_from_string_internal(
            unit_string, match_flags - recursion_modifier);
        if (!is_valid(retunit)) {
            return precise::invalid;
        }
        if (power == 1) {
            return retunit;
        }
        if (power == -1) {
            return retunit.inv();
        }
        return retunit.pow(power);
    }
    return precise::defunit;
}